

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

void __thiscall
CS248::HalfedgeMesh::rebuild
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *polygons,vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_> *vertexPositions)

{
  std::__cxx11::list<CS248::Halfedge,_std::allocator<CS248::Halfedge>_>::clear(&this->halfedges);
  std::__cxx11::list<CS248::Vertex,_std::allocator<CS248::Vertex>_>::clear(&this->vertices);
  std::__cxx11::list<CS248::Edge,_std::allocator<CS248::Edge>_>::clear(&this->edges);
  std::__cxx11::list<CS248::Face,_std::allocator<CS248::Face>_>::clear(&this->faces);
  std::__cxx11::list<CS248::Face,_std::allocator<CS248::Face>_>::clear(&this->boundaries);
  build(this,polygons,vertexPositions);
  return;
}

Assistant:

void HalfedgeMesh::rebuild(const vector<vector<Index> >& polygons,
                           const vector<Vector3D>& vertexPositions) {
  // Clear old elements
  halfedges.clear();
  vertices.clear();
  edges.clear();
  faces.clear();
  boundaries.clear();

  // Create new mesh
  build(polygons, vertexPositions);
}